

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_inv_txfm2d_add_4x16_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  int iVar1;
  longlong lVar2;
  int iVar3;
  int iVar4;
  longlong lVar5;
  int iVar6;
  longlong lVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined4 uVar23;
  longlong lVar24;
  __m128i *out;
  long lVar25;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  int in_stack_00000008;
  __m128i u3_1;
  __m128i u2_1;
  __m128i u1_1;
  __m128i u0_1;
  int j_1;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  int j;
  __m128i *buf0_cur;
  int32_t *input_row;
  int i;
  __m128i buf0 [16];
  int lr_flip;
  int ud_flip;
  int input_stride;
  transform_1d_sse4_1 col_txfm;
  transform_1d_sse4_1 row_txfm;
  int buf_size_h_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [16];
  int in_stack_fffffffffffffae0;
  int size;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  int in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  int in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  int in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  __m128i *in_stack_fffffffffffffb28;
  int local_4cc;
  int local_484;
  int local_46c;
  longlong local_468 [32];
  int local_364;
  int local_360;
  int local_35c;
  transform_1d_sse4_1 local_358;
  transform_1d_sse4_1 local_350;
  int local_344;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  char *local_330;
  longlong local_328;
  int aiStack_320 [64];
  byte local_21e;
  byte local_21d;
  long local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  longlong lStack_180;
  undefined8 local_178;
  longlong lStack_170;
  undefined8 local_168;
  longlong lStack_160;
  undefined8 local_158;
  longlong lStack_150;
  undefined8 local_148;
  longlong lStack_140;
  undefined8 local_138;
  longlong lStack_130;
  undefined8 local_128;
  longlong lStack_120;
  undefined8 local_118;
  longlong lStack_110;
  longlong local_108;
  undefined8 uStack_100;
  longlong local_f8;
  undefined8 uStack_f0;
  longlong local_e8;
  undefined8 uStack_e0;
  longlong local_d8;
  undefined8 uStack_d0;
  longlong local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  undefined8 uStack_b0;
  longlong local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_330 = av1_inv_txfm_shift_ls[in_R8B];
  local_21e = in_R8B;
  local_21d = in_CL;
  local_210 = in_RDI;
  local_334 = get_txw_idx(in_R8B);
  local_338 = get_txh_idx(local_21e);
  local_33c = tx_size_wide[local_21e];
  local_340 = tx_size_high[local_21e];
  local_344 = local_340 >> 2;
  local_350 = highbd_txfm_all_1d_zeros_w8_arr[local_334][""[local_21d]][0];
  local_358 = highbd_txfm_all_1d_zeros_w8_arr[local_338][""[local_21d]][2];
  size = local_340;
  if (0x20 < local_340) {
    size = 0x20;
  }
  local_35c = size;
  get_flip_cfg(local_21d,&local_360,&local_364);
  for (local_46c = 0; local_46c < local_340 >> 2; local_46c = local_46c + 1) {
    out = (__m128i *)(local_468 + (long)(local_46c << 2) * 2);
    load_buffer_32bit_input
              ((int32_t *)(local_210 + (long)(local_46c << 2) * 4),local_35c,out,local_33c);
    (*local_350)(out,out,0xc,0,in_stack_00000008,-(int)*local_330);
  }
  if (local_364 == 0) {
    for (local_4cc = 0; local_4cc < local_344; local_4cc = local_4cc + 1) {
      lVar25 = (long)(local_4cc << 2);
      local_158 = local_468[lVar25 * 2];
      local_168 = local_468[lVar25 * 2 + 2];
      lVar24 = local_158;
      lStack_150 = local_468[lVar25 * 2 + 1];
      lVar7 = local_168;
      lStack_160 = local_468[lVar25 * 2 + 3];
      in_stack_fffffffffffffb18 = (int)local_158;
      local_158._4_4_ = (int)((ulong)local_158 >> 0x20);
      in_stack_fffffffffffffb20 = local_158._4_4_;
      in_stack_fffffffffffffb1c = (int)local_168;
      local_168._4_4_ = (int)((ulong)local_168 >> 0x20);
      in_stack_fffffffffffffb24 = local_168._4_4_;
      lVar25 = (long)(local_4cc << 2);
      uStack_d0 = local_468[lVar25 * 2 + 1];
      uStack_e0 = local_468[lVar25 * 2 + 3];
      local_d8 = local_468[lVar25 * 2];
      lVar15 = uStack_d0;
      local_e8 = local_468[lVar25 * 2 + 2];
      lVar14 = uStack_e0;
      iVar9 = (int)uStack_d0;
      uStack_d0._4_4_ = (int)((ulong)uStack_d0 >> 0x20);
      in_stack_fffffffffffffb10 = uStack_d0._4_4_;
      iVar8 = (int)uStack_e0;
      uStack_e0._4_4_ = (int)((ulong)uStack_e0 >> 0x20);
      in_stack_fffffffffffffb14 = uStack_e0._4_4_;
      lVar25 = (long)(local_4cc << 2);
      local_178 = local_468[lVar25 * 2 + 4];
      local_188 = local_468[lVar25 * 2 + 6];
      lVar5 = local_178;
      lStack_170 = local_468[lVar25 * 2 + 5];
      lVar2 = local_188;
      lStack_180 = local_468[lVar25 * 2 + 7];
      iVar4 = (int)local_178;
      local_178._4_4_ = (int)((ulong)local_178 >> 0x20);
      iVar6 = local_178._4_4_;
      iVar1 = (int)local_188;
      local_188._4_4_ = (int)((ulong)local_188 >> 0x20);
      iVar3 = local_188._4_4_;
      lVar25 = (long)(local_4cc << 2);
      uStack_f0 = local_468[lVar25 * 2 + 5];
      uStack_100 = local_468[lVar25 * 2 + 7];
      local_f8 = local_468[lVar25 * 2 + 4];
      lVar13 = uStack_f0;
      local_108 = local_468[lVar25 * 2 + 6];
      lVar12 = uStack_100;
      in_stack_fffffffffffffae8 = (int)uStack_f0;
      uStack_f0._4_4_ = (int)((ulong)uStack_f0 >> 0x20);
      in_stack_fffffffffffffaf0 = uStack_f0._4_4_;
      in_stack_fffffffffffffaec = (int)uStack_100;
      uStack_100._4_4_ = (int)((ulong)uStack_100 >> 0x20);
      in_stack_fffffffffffffaf4 = uStack_100._4_4_;
      local_1d8 = CONCAT44((int)local_168,(int)local_158);
      uStack_1d0 = CONCAT44(local_168._4_4_,local_158._4_4_);
      local_1e8 = CONCAT44((int)local_188,(int)local_178);
      uStack_1e0 = CONCAT44(local_188._4_4_,local_178._4_4_);
      lVar25 = (long)(local_4cc << 2);
      local_188 = lVar2;
      local_178 = lVar5;
      local_168 = lVar7;
      uStack_100 = lVar12;
      uStack_f0 = lVar13;
      uStack_e0 = lVar14;
      uStack_d0 = lVar15;
      *(int *)(&local_328 + lVar25 * 2) = (int)local_158;
      local_158 = lVar24;
      aiStack_320[lVar25 * 4 + -1] = in_stack_fffffffffffffb1c;
      aiStack_320[lVar25 * 4] = iVar4;
      aiStack_320[lVar25 * 4 + 1] = iVar1;
      local_58 = CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18);
      uStack_50 = CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20);
      local_68 = CONCAT44(iVar1,iVar4);
      uStack_60 = CONCAT44(iVar3,iVar6);
      lVar25 = (long)(local_4cc << 2);
      aiStack_320[lVar25 * 4 + 2] = in_stack_fffffffffffffb20;
      aiStack_320[lVar25 * 4 + 3] = in_stack_fffffffffffffb24;
      aiStack_320[lVar25 * 4 + 4] = iVar6;
      aiStack_320[lVar25 * 4 + 5] = iVar3;
      local_1f8 = CONCAT44(iVar8,iVar9);
      uStack_1f0 = CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10);
      local_208 = CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8);
      uStack_200 = CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
      lVar25 = (long)(local_4cc << 2);
      aiStack_320[lVar25 * 4 + 6] = iVar9;
      aiStack_320[lVar25 * 4 + 7] = iVar8;
      aiStack_320[lVar25 * 4 + 8] = in_stack_fffffffffffffae8;
      aiStack_320[lVar25 * 4 + 9] = in_stack_fffffffffffffaec;
      local_78 = CONCAT44(iVar8,iVar9);
      uStack_70 = CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10);
      local_88 = CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8);
      uStack_80 = CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
      lVar25 = (long)(local_4cc * 4 + 3);
      *(int *)(&local_328 + lVar25 * 2) = in_stack_fffffffffffffb10;
      aiStack_320[lVar25 * 4 + -1] = in_stack_fffffffffffffb14;
      aiStack_320[lVar25 * 4] = in_stack_fffffffffffffaf0;
      aiStack_320[lVar25 * 4 + 1] = in_stack_fffffffffffffaf4;
    }
  }
  else {
    for (local_484 = 0; local_484 < local_344; local_484 = local_484 + 1) {
      lVar25 = (long)(local_484 << 2);
      local_128 = local_468[lVar25 * 2 + 4];
      local_118 = local_468[lVar25 * 2 + 6];
      lVar24 = local_118;
      lStack_110 = local_468[lVar25 * 2 + 7];
      lVar7 = local_128;
      lStack_120 = local_468[lVar25 * 2 + 5];
      uVar10 = (undefined4)local_118;
      local_118._4_4_ = (int)((ulong)local_118 >> 0x20);
      iVar11 = local_118._4_4_;
      iVar8 = (int)local_128;
      local_128._4_4_ = (int)((ulong)local_128 >> 0x20);
      iVar9 = local_128._4_4_;
      lVar25 = (long)(local_484 << 2);
      uStack_a0 = local_468[lVar25 * 2 + 5];
      uStack_90 = local_468[lVar25 * 2 + 7];
      local_98 = local_468[lVar25 * 2 + 6];
      lVar15 = uStack_90;
      local_a8 = local_468[lVar25 * 2 + 4];
      lVar14 = uStack_a0;
      iVar22 = (int)uStack_90;
      uStack_90._4_4_ = (undefined4)((ulong)uStack_90 >> 0x20);
      uVar23 = uStack_90._4_4_;
      iVar20 = (int)uStack_a0;
      uStack_a0._4_4_ = (int)((ulong)uStack_a0 >> 0x20);
      iVar21 = uStack_a0._4_4_;
      lVar25 = (long)(local_484 << 2);
      local_148 = local_468[lVar25 * 2];
      local_138 = local_468[lVar25 * 2 + 2];
      lVar5 = local_138;
      lStack_130 = local_468[lVar25 * 2 + 3];
      lVar2 = local_148;
      lStack_140 = local_468[lVar25 * 2 + 1];
      iVar4 = (int)local_138;
      local_138._4_4_ = (int)((ulong)local_138 >> 0x20);
      iVar6 = local_138._4_4_;
      iVar1 = (int)local_148;
      local_148._4_4_ = (int)((ulong)local_148 >> 0x20);
      iVar3 = local_148._4_4_;
      lVar25 = (long)(local_484 << 2);
      uStack_c0 = local_468[lVar25 * 2 + 1];
      uStack_b0 = local_468[lVar25 * 2 + 3];
      local_b8 = local_468[lVar25 * 2 + 2];
      lVar13 = uStack_b0;
      local_c8 = local_468[lVar25 * 2];
      lVar12 = uStack_c0;
      iVar18 = (int)uStack_b0;
      uStack_b0._4_4_ = (int)((ulong)uStack_b0 >> 0x20);
      iVar19 = uStack_b0._4_4_;
      iVar16 = (int)uStack_c0;
      uStack_c0._4_4_ = (int)((ulong)uStack_c0 >> 0x20);
      iVar17 = uStack_c0._4_4_;
      local_198 = CONCAT44((int)local_128,(undefined4)local_118);
      uStack_190 = CONCAT44(local_128._4_4_,local_118._4_4_);
      local_1a8 = CONCAT44((int)local_148,(int)local_138);
      uStack_1a0 = CONCAT44(local_148._4_4_,local_138._4_4_);
      lVar25 = (long)(local_484 << 2);
      local_148 = lVar2;
      local_138 = lVar5;
      local_128 = lVar7;
      uStack_c0 = lVar12;
      uStack_b0 = lVar13;
      uStack_a0 = lVar14;
      uStack_90 = lVar15;
      *(undefined4 *)(&local_328 + lVar25 * 2) = (undefined4)local_118;
      local_118 = lVar24;
      aiStack_320[lVar25 * 4 + -1] = iVar8;
      aiStack_320[lVar25 * 4] = iVar4;
      aiStack_320[lVar25 * 4 + 1] = iVar1;
      local_18 = CONCAT44(iVar8,uVar10);
      uStack_10 = CONCAT44(iVar9,iVar11);
      local_28 = CONCAT44(iVar1,iVar4);
      uStack_20 = CONCAT44(iVar3,iVar6);
      lVar25 = (long)(local_484 << 2);
      aiStack_320[lVar25 * 4 + 2] = iVar11;
      aiStack_320[lVar25 * 4 + 3] = iVar9;
      aiStack_320[lVar25 * 4 + 4] = iVar6;
      aiStack_320[lVar25 * 4 + 5] = iVar3;
      local_1b8 = CONCAT44(iVar20,iVar22);
      uStack_1b0 = CONCAT44(iVar21,uVar23);
      local_1c8 = CONCAT44(iVar16,iVar18);
      uStack_1c0 = CONCAT44(iVar17,iVar19);
      lVar25 = (long)(local_484 << 2);
      aiStack_320[lVar25 * 4 + 6] = iVar22;
      aiStack_320[lVar25 * 4 + 7] = iVar20;
      aiStack_320[lVar25 * 4 + 8] = iVar18;
      aiStack_320[lVar25 * 4 + 9] = iVar16;
      local_38 = CONCAT44(iVar20,iVar22);
      uStack_30 = CONCAT44(iVar21,uVar23);
      local_48 = CONCAT44(iVar16,iVar18);
      uStack_40 = CONCAT44(iVar17,iVar19);
      lVar25 = (long)(local_484 * 4 + 3);
      *(undefined4 *)(&local_328 + lVar25 * 2) = uVar23;
      aiStack_320[lVar25 * 4 + -1] = iVar21;
      aiStack_320[lVar25 * 4] = iVar19;
      aiStack_320[lVar25 * 4 + 1] = iVar17;
    }
  }
  (*local_358)((__m128i *)&local_328,(__m128i *)&local_328,0xc,1,in_stack_00000008,0);
  av1_round_shift_array_32_sse4_1
            ((__m128i *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (__m128i *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),size,
             in_stack_fffffffffffffae0);
  highbd_write_buffer_4xn_sse4_1
            (in_stack_fffffffffffffb28,
             (uint16_t *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
             in_stack_fffffffffffffb10);
  return;
}

Assistant:

static void highbd_inv_txfm2d_add_4x16_sse4_1(const int32_t *input,
                                              uint16_t *output, int stride,
                                              TX_TYPE tx_type, TX_SIZE tx_size,
                                              int eob, const int bd) {
  (void)eob;
  __m128i buf1[16];
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_h_div8 = txfm_size_row >> 2;
  const transform_1d_sse4_1 row_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][0];
  const transform_1d_sse4_1 col_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][2];
  const int input_stride = AOMMIN(32, txfm_size_row);

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // 1st stage: column transform
  __m128i buf0[16];
  for (int i = 0; i < (txfm_size_row >> 2); i++) {
    const int32_t *input_row = input + i * 4;
    __m128i *buf0_cur = buf0 + i * 4;
    load_buffer_32bit_input(input_row, input_stride, buf0_cur, txfm_size_col);
    row_txfm(buf0_cur, buf0_cur, INV_COS_BIT, 0, bd, -shift[0]);
  }

  if (lr_flip) {
    for (int j = 0; j < buf_size_h_div8; ++j) {
      TRANSPOSE_4X4(buf0[4 * j + 3], buf0[4 * j + 2], buf0[4 * j + 1],
                    buf0[4 * j], buf1[4 * j], buf1[4 * j + 1], buf1[4 * j + 2],
                    buf1[4 * j + 3]);
    }
  } else {
    for (int j = 0; j < buf_size_h_div8; ++j) {
      TRANSPOSE_4X4(buf0[4 * j], buf0[4 * j + 1], buf0[4 * j + 2],
                    buf0[4 * j + 3], buf1[4 * j], buf1[4 * j + 1],
                    buf1[4 * j + 2], buf1[4 * j + 3]);
    }
  }

  // 2nd stage: column transform
  col_txfm(buf1, buf1, INV_COS_BIT, 1, bd, 0);

  av1_round_shift_array_32_sse4_1(buf1, buf1, txfm_size_row, -shift[1]);

  // write to buffer
  highbd_write_buffer_4xn_sse4_1(buf1, output, stride, ud_flip, txfm_size_row,
                                 bd);
}